

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

Float pbrt::SampleCatmullRom
                (span<const_float> x,span<const_float> f,span<const_float> F,Float u,Float *fval,
                Float *pdf)

{
  float fVar1;
  undefined1 auVar2 [16];
  anon_class_56_7_ed507bea f_00;
  int iVar3;
  size_t sVar4;
  float *pfVar5;
  float in_XMM0_Da;
  float fVar6;
  Float FVar7;
  float *in_stack_00000008;
  float *in_stack_00000010;
  Float t;
  anon_class_56_7_ed507bea eval;
  Float fhat;
  Float Fhat;
  Float d1;
  Float d0;
  Float width;
  Float f1;
  Float f0;
  Float x1;
  Float x0;
  int i;
  size_t vb_1;
  size_t va_1;
  size_t vb;
  size_t va;
  anon_class_16_2_94731ad8 *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  char *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  char *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  LogLevel in_stack_ffffffffffffff04;
  Float in_stack_ffffffffffffff08;
  Float in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  unsigned_long *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  unsigned_long *in_stack_ffffffffffffff28;
  undefined1 *puVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Float *pFVar12;
  float local_9c;
  undefined1 local_98 [4];
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  span<const_float> *local_78;
  float *local_70;
  int local_64;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  float local_3c;
  span<const_float> local_38;
  span<const_float> local_28;
  span<const_float> local_18;
  
  local_3c = in_XMM0_Da;
  local_48 = pstd::span<const_float>::size(&local_18);
  local_50 = pstd::span<const_float>::size(&local_28);
  if (local_48 != local_50) {
    LogFatal<char_const(&)[9],char_const(&)[9],char_const(&)[9],unsigned_long&,char_const(&)[9],unsigned_long&>
              (in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
               in_stack_fffffffffffffee8,
               (char (*) [9])CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (char (*) [9])CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (char (*) [9])CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff18,
               (char (*) [9])CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff28);
  }
  local_58 = pstd::span<const_float>::size(&local_28);
  local_60 = pstd::span<const_float>::size(&local_38);
  if (local_58 != local_60) {
    LogFatal<char_const(&)[9],char_const(&)[9],char_const(&)[9],unsigned_long&,char_const(&)[9],unsigned_long&>
              (in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
               in_stack_fffffffffffffee8,
               (char (*) [9])CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (char (*) [9])CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (char (*) [9])CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff18,
               (char (*) [9])CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff28);
  }
  fVar6 = pstd::span<const_float>::back(&local_38);
  local_3c = fVar6 * local_3c;
  pstd::span<const_float>::size(&local_38);
  local_78 = &local_38;
  local_70 = &local_3c;
  sVar4 = FindInterval<pbrt::SampleCatmullRom(pstd::span<float_const>,pstd::span<float_const>,pstd::span<float_const>,float,float*,float*)::__0>
                    (CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffeb8);
  local_64 = (int)sVar4;
  pfVar5 = pstd::span<const_float>::operator[](&local_18,(long)local_64);
  local_7c = *pfVar5;
  pfVar5 = pstd::span<const_float>::operator[](&local_18,(long)(local_64 + 1));
  local_80 = *pfVar5;
  pfVar5 = pstd::span<const_float>::operator[](&local_28,(long)local_64);
  local_84 = *pfVar5;
  pfVar5 = pstd::span<const_float>::operator[](&local_28,(long)(local_64 + 1));
  fVar6 = *pfVar5;
  local_90 = local_80 - local_7c;
  local_8c = local_90;
  local_88 = fVar6;
  if (local_64 < 1) {
    local_90 = fVar6 - local_84;
  }
  else {
    pfVar5 = pstd::span<const_float>::operator[](&local_28,(long)(local_64 + -1));
    local_90 = local_90 * (fVar6 - *pfVar5);
    fVar6 = local_80;
    pfVar5 = pstd::span<const_float>::operator[](&local_18,(long)(local_64 + -1));
    local_90 = local_90 / (fVar6 - *pfVar5);
  }
  iVar3 = local_64 + 2;
  sVar4 = pstd::span<const_float>::size(&local_18);
  fVar6 = local_8c;
  if ((ulong)(long)iVar3 < sVar4) {
    pfVar5 = pstd::span<const_float>::operator[](&local_28,(long)(local_64 + 2));
    fVar1 = *pfVar5 - local_84;
    pfVar5 = pstd::span<const_float>::operator[](&local_18,(long)(local_64 + 2));
    local_94 = (fVar6 * fVar1) / (*pfVar5 - local_7c);
  }
  else {
    local_94 = local_88 - local_84;
  }
  pfVar5 = pstd::span<const_float>::operator[](&local_38,(long)local_64);
  local_3c = (local_3c - *pfVar5) / local_8c;
  puVar8 = local_98;
  pfVar5 = &local_84;
  pfVar9 = &local_90;
  pfVar10 = &local_94;
  pfVar11 = &local_88;
  pFVar12 = &local_9c;
  memcpy(&stack0xfffffffffffffee8,&stack0xffffffffffffff28,0x38);
  f_00.Fhat._4_4_ = in_stack_ffffffffffffff24;
  f_00.Fhat._0_4_ = in_stack_ffffffffffffff20;
  f_00.f0 = (Float *)puVar8;
  f_00.d0 = pfVar5;
  f_00.d1 = pfVar9;
  f_00.f1 = pfVar10;
  f_00.fhat = pfVar11;
  f_00.u = pFVar12;
  FVar7 = NewtonBisection<int,pbrt::SampleCatmullRom(pstd::span<float_const>,pstd::span<float_const>,pstd::span<float_const>,float,float*,float*)::__1>
                    (in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,f_00,
                     in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                     (enable_if_t<std::is_integral<int>::value> *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  if (in_stack_00000008 != (float *)0x0) {
    *in_stack_00000008 = local_9c;
  }
  if (in_stack_00000010 != (float *)0x0) {
    fVar6 = pstd::span<const_float>::back(&local_38);
    *in_stack_00000010 = local_9c / fVar6;
  }
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)FVar7),ZEXT416((uint)local_8c),ZEXT416((uint)local_7c));
  return auVar2._0_4_;
}

Assistant:

Float SampleCatmullRom(pstd::span<const Float> x, pstd::span<const Float> f,
                       pstd::span<const Float> F, Float u, Float *fval, Float *pdf) {
    CHECK_EQ(x.size(), f.size());
    CHECK_EQ(f.size(), F.size());
    // Map _u_ to a spline interval by inverting _F_
    u *= F.back();
    int i = FindInterval(F.size(), [&](int i) { return F[i] <= u; });

    // Look up $x_i$ and function values of spline segment _i_
    Float x0 = x[i], x1 = x[i + 1];
    Float f0 = f[i], f1 = f[i + 1];
    Float width = x1 - x0;

    // Approximate derivatives using finite differences
    Float d0, d1;
    if (i > 0)
        d0 = width * (f1 - f[i - 1]) / (x1 - x[i - 1]);
    else
        d0 = f1 - f0;
    if (i + 2 < x.size())
        d1 = width * (f[i + 2] - f0) / (x[i + 2] - x0);
    else
        d1 = f1 - f0;

    // Re-scale _u_ for continous spline sampling step
    u = (u - F[i]) / width;

    // Invert definite integral over spline segment
    Float Fhat, fhat;
    auto eval = [&](Float t) -> std::pair<Float, Float> {
        Fhat =
            EvaluatePolynomial(t, 0, f0, .5f * d0, (1.f / 3.f) * (-2 * d0 - d1) + f1 - f0,
                               .25f * (d0 + d1) + .5f * (f0 - f1));
        fhat = EvaluatePolynomial(t, f0, d0, -2 * d0 - d1 + 3 * (f1 - f0),
                                  d0 + d1 + 2 * (f0 - f1));
        return {Fhat - u, fhat};
    };
    Float t = NewtonBisection(0, 1, eval);

    if (fval != nullptr)
        *fval = fhat;
    if (pdf != nullptr)
        *pdf = fhat / F.back();
    return x0 + width * t;
}